

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<14UL>
mserialize::cx_strcat<4ul,4ul,5ul,1ul>
          (cx_string<4UL> *strings,cx_string<4UL> *strings_1,cx_string<5UL> *strings_2,
          cx_string<1UL> *strings_3)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  char buffer [15];
  ulong auStack_78 [7];
  cx_string<4UL> *local_40 [2];
  cx_string<5UL> *local_30;
  cx_string<1UL> *local_28;
  cx_string<14UL> local_18;
  
  pcVar1 = buffer;
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  local_40[0] = strings;
  local_40[1] = strings_1;
  local_30 = strings_2;
  local_28 = strings_3;
  auStack_78[1] = 4;
  auStack_78[2] = 4;
  auStack_78[3] = 5;
  auStack_78[4] = 1;
  for (lVar2 = 1; lVar2 != 5; lVar2 = lVar2 + 1) {
    for (uVar3 = 0; uVar3 < auStack_78[lVar2]; uVar3 = uVar3 + 1) {
      pcVar1[uVar3] = local_40[lVar2 + -1]->_data[uVar3];
    }
    pcVar1 = pcVar1 + uVar3;
  }
  cx_string<14UL>::cx_string(&local_18,buffer);
  return (cx_string<14UL>)local_18._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}